

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatastream.h
# Opt level: O1

QDataStream *
QtPrivate::readArrayBasedContainer<QList<std::pair<QByteArray,QByteArray>>>
          (QDataStream *s,QList<std::pair<QByteArray,_QByteArray>_> *c)

{
  QDataStream QVar1;
  QDataStream QVar2;
  char cVar3;
  QDataStream *pQVar4;
  QArrayData *asize;
  long in_FS_OFFSET;
  qint64 extendedLen;
  quint32 first;
  pair<QByteArray,_QByteArray> local_78;
  uint local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QVar1 = s[0x13];
  cVar3 = QDataStream::isDeviceTransactionStarted();
  if (cVar3 == '\0') {
    QDataStream::resetStatus();
  }
  QList<std::pair<QByteArray,_QByteArray>_>::clear(c);
  local_3c = 0xaaaaaaaa;
  QDataStream::operator>>(s,(int *)&local_3c);
  asize = (QArrayData *)(ulong)local_3c;
  if (asize == (QArrayData *)0xffffffff) {
    asize = (QArrayData *)0xffffffffffffffff;
  }
  else if ((local_3c == 0xfffffffe) && (0x15 < *(int *)(s + 0x18))) {
    local_78.first.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    QDataStream::operator>>(s,(longlong *)&local_78);
    asize = &(local_78.first.d.d)->super_QArrayData;
  }
  if ((long)asize < 0) {
    QDataStream::setStatus((Status)s);
  }
  else {
    QList<std::pair<QByteArray,_QByteArray>_>::reserve(c,(qsizetype)asize);
    if (asize != (QArrayData *)0x0) {
      do {
        asize = (QArrayData *)((long)&asize[-1].alloc + 7);
        local_78.second.d.ptr = (char *)0x0;
        local_78.second.d.size = 0;
        local_78.first.d.size = 0;
        local_78.second.d.d = (Data *)0x0;
        local_78.first.d.d = (Data *)0x0;
        local_78.first.d.ptr = (char *)0x0;
        pQVar4 = (QDataStream *)operator>>(s,&local_78.first);
        operator>>(pQVar4,&local_78.second);
        QVar2 = s[0x13];
        if (QVar2 == (QDataStream)0x0) {
          QMovableArrayOps<std::pair<QByteArray,QByteArray>>::
          emplace<std::pair<QByteArray,QByteArray>const&>
                    ((QMovableArrayOps<std::pair<QByteArray,QByteArray>> *)c,(c->d).size,&local_78);
          QList<std::pair<QByteArray,_QByteArray>_>::end(c);
        }
        else {
          QList<std::pair<QByteArray,_QByteArray>_>::clear(c);
        }
        if (&(local_78.second.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_78.second.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_78.second.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
               + -1;
          UNLOCK();
          if (((local_78.second.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
              == 0) {
            QArrayData::deallocate(&(local_78.second.d.d)->super_QArrayData,1,0x10);
          }
        }
        if (&(local_78.first.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_78.first.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_78.first.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
               + -1;
          UNLOCK();
          if (((local_78.first.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
              == 0) {
            QArrayData::deallocate(&(local_78.first.d.d)->super_QArrayData,1,0x10);
          }
        }
      } while ((QVar2 == (QDataStream)0x0) && (asize != (QArrayData *)0x0));
    }
  }
  if (QVar1 != (QDataStream)0x0) {
    QDataStream::resetStatus();
    QDataStream::setStatus((Status)s);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return s;
}

Assistant:

QDataStream &readArrayBasedContainer(QDataStream &s, Container &c)
{
    StreamStateSaver stateSaver(&s);

    c.clear();
    qint64 size = QDataStream::readQSizeType(s);
    qsizetype n = size;
    if (size != n || size < 0) {
        s.setStatus(QDataStream::SizeLimitExceeded);
        return s;
    }
    c.reserve(n);
    for (qsizetype i = 0; i < n; ++i) {
        typename Container::value_type t;
        s >> t;
        if (s.status() != QDataStream::Ok) {
            c.clear();
            break;
        }
        c.append(t);
    }

    return s;
}